

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactor<double>::eliminatePivot(CLUFactor<double> *this,int prow,int pos,double eps)

{
  double val;
  int iVar1;
  int iVar2;
  int p_col;
  int *piVar3;
  pointer pdVar4;
  Pring *pPVar5;
  Pring *pPVar6;
  int *piVar7;
  double *pdVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  Pring *pPVar13;
  int *piVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  
  piVar3 = (this->u).row.len;
  iVar1 = (this->u).row.start[prow];
  lVar19 = (long)iVar1;
  iVar2 = piVar3[prow];
  iVar15 = (int)((long)iVar2 + -1);
  piVar3[prow] = iVar15;
  iVar17 = pos + iVar1;
  pdVar4 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->u).row.idx;
  p_col = piVar3[iVar17];
  val = pdVar4[iVar17];
  pPVar5 = (this->temp).pivot_col;
  pPVar6 = pPVar5[p_col].next;
  pPVar6->prev = pPVar5[p_col].prev;
  (pPVar5[p_col].prev)->next = pPVar6;
  pPVar5[p_col].next = pPVar5 + p_col;
  pPVar5[p_col].prev = pPVar5 + p_col;
  lVar18 = (long)(iVar15 + iVar1);
  piVar3[iVar17] = piVar3[lVar18];
  pdVar4[iVar17] = pdVar4[lVar18];
  iVar1 = (this->temp).stage;
  (this->temp).stage = iVar1 + 1;
  setPivot(this,iVar1,p_col,prow,val);
  iVar1 = (this->temp).s_cact[p_col];
  iVar17 = -1;
  if (1 < iVar1) {
    iVar17 = makeLvec(this,iVar1 + -1,prow);
  }
  if (1 < iVar2) {
    pdVar4 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->u).row.idx;
    piVar7 = (this->temp).s_mark;
    pdVar8 = this->work;
    pPVar5 = (this->temp).pivot_col;
    piVar9 = (this->u).col.start;
    piVar10 = (this->u).col.len;
    piVar11 = (this->temp).s_cact;
    piVar12 = (this->u).col.idx;
    do {
      iVar1 = piVar3[lVar19];
      piVar7[iVar1] = 1;
      pdVar8[iVar1] = pdVar4[lVar19];
      pPVar6 = pPVar5[iVar1].next;
      pPVar6->prev = pPVar5[iVar1].prev;
      (pPVar5[iVar1].prev)->next = pPVar6;
      iVar15 = (piVar10[iVar1] + piVar9[iVar1]) - piVar11[iVar1];
      piVar14 = piVar12 + iVar15;
      do {
        piVar16 = piVar14;
        piVar14 = piVar16 + 1;
      } while (*piVar16 != prow);
      *piVar16 = piVar12[iVar15];
      piVar12[iVar15] = prow;
      piVar14 = piVar11 + iVar1;
      *piVar14 = *piVar14 + -1;
      lVar19 = lVar19 + 1;
    } while (lVar19 < lVar18);
  }
  uVar21 = (long)(this->u).col.len[p_col] - (long)(this->temp).s_cact[p_col];
  iVar1 = (this->u).col.idx[(long)(this->u).col.start[p_col] + uVar21];
  while (iVar1 != prow) {
    updateRow(this,iVar1,iVar17,prow,p_col,val,eps);
    uVar20 = (int)uVar21 + 1;
    uVar21 = (ulong)uVar20;
    iVar17 = iVar17 + 1;
    iVar1 = (this->u).col.idx[(int)((this->u).col.start[p_col] + uVar20)];
  }
  iVar1 = (this->u).col.len[p_col];
  iVar15 = (int)uVar21 + 1;
  if (iVar15 < iVar1) {
    do {
      updateRow(this,(this->u).col.idx[(this->u).col.start[p_col] + iVar15],iVar17,prow,p_col,val,
                eps);
      iVar15 = iVar15 + 1;
      iVar17 = iVar17 + 1;
    } while (iVar1 != iVar15);
  }
  piVar7 = (this->temp).s_cact;
  piVar3 = (this->u).col.len + p_col;
  *piVar3 = *piVar3 - piVar7[p_col];
  if (1 < iVar2) {
    piVar3 = (this->u).row.idx;
    lVar18 = (long)(this->u).row.start[prow];
    lVar19 = (long)iVar2 + -1 + lVar18;
    pdVar8 = this->work;
    piVar9 = (this->temp).s_mark;
    pPVar5 = (this->temp).pivot_colNZ;
    pPVar6 = (this->temp).pivot_col;
    do {
      iVar1 = piVar3[lVar18];
      pdVar8[iVar1] = 0.0;
      piVar9[iVar1] = 0;
      iVar2 = piVar7[iVar1];
      pPVar13 = pPVar5[iVar2].next;
      pPVar6[iVar1].next = pPVar13;
      pPVar13->prev = pPVar6 + iVar1;
      pPVar6[iVar1].prev = pPVar5 + iVar2;
      pPVar5[iVar2].next = pPVar6 + iVar1;
      lVar18 = lVar18 + 1;
    } while (lVar18 < lVar19);
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminatePivot(int prow, int pos, R eps)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   R pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L VectorBase<R> */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working VectorBase<R>,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval, eps);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval, eps);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working VectorBase<R> and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}